

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# galloping_search.hpp
# Opt level: O0

_List_iterator<signed_char>
burst::detail::
galloping_search<std::_List_iterator<signed_char>,int,burst::not_fn_t<burst::invert_t<std::less<void>>>>
          (_List_iterator<signed_char> first,_List_iterator<signed_char> last,int *value)

{
  anon_class_16_2_ce2e793d __pred;
  bool bVar1;
  difference_type dVar2;
  reference as;
  _List_iterator<signed_char> _Var3;
  _List_iterator<signed_char> local_80;
  _List_iterator<signed_char> current;
  difference_type step;
  difference_type position;
  difference_type distance;
  int *value_local;
  _List_iterator<signed_char> local_20;
  _List_iterator<signed_char> last_local;
  _List_iterator<signed_char> first_local;
  
  __pred.compare = (not_fn_t<burst::invert_t<std::less<void>_>_> *)((long)&value_local + 7);
  __pred.value = value;
  local_20._M_node = last._M_node;
  last_local._M_node = first._M_node;
  bVar1 = std::
          is_partitioned<std::_List_iterator<signed_char>,burst::detail::galloping_search<std::_List_iterator<signed_char>,int,burst::not_fn_t<burst::invert_t<std::less<void>>>>(std::_List_iterator<signed_char>,std::_List_iterator<signed_char>,int_const&,burst::not_fn_t<burst::invert_t<std::less<void>>>)::_lambda(auto:1_const&)_1_>
                    (first,last,__pred);
  if (!bVar1) {
    __assert_fail("std::is_partitioned(first, last, [& value, & compare] (const auto & e) {return compare(e, value);})"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/algorithm/detail/galloping_search.hpp"
                  ,0x16,
                  "RandomAccessIterator burst::detail::galloping_search(RandomAccessIterator, RandomAccessIterator, const Value &, Compare) [RandomAccessIterator = std::_List_iterator<signed char>, Value = int, Compare = burst::not_fn_t<burst::invert_t<std::less<void>>>]"
                 );
  }
  dVar2 = std::distance<std::_List_iterator<signed_char>>(last_local,local_20);
  step = 0;
  current._M_node = (_List_node_base *)0x1;
  while( true ) {
    if (dVar2 <= (long)&(current._M_node)->_M_next + step) {
      _Var3 = std::
              lower_bound<std::_List_iterator<signed_char>,int,burst::not_fn_t<burst::invert_t<std::less<void>>>>
                        (last_local._M_node,local_20._M_node,value);
      return (_List_iterator<signed_char>)_Var3._M_node;
    }
    local_80 = std::next<std::_List_iterator<signed_char>>(last_local,current._M_node);
    as = std::_List_iterator<signed_char>::operator*(&local_80);
    bVar1 = not_fn_t<burst::invert_t<std::less<void>>>::operator()
                      ((void *)((long)&value_local + 7),as,value);
    if (!bVar1) break;
    last_local = std::next<std::_List_iterator<signed_char>>(local_80,1);
    step = (long)&(current._M_node)->_M_next + step + 1;
    current._M_node = current._M_node << 1;
  }
  _Var3 = std::
          lower_bound<std::_List_iterator<signed_char>,int,burst::not_fn_t<burst::invert_t<std::less<void>>>>
                    (last_local._M_node,local_80._M_node,value);
  return (_List_iterator<signed_char>)_Var3._M_node;
}

Assistant:

RandomAccessIterator
            galloping_search
            (
                RandomAccessIterator first, RandomAccessIterator last,
                const Value & value,
                Compare compare
            )
        {
            assert(std::is_partitioned(first, last,
                [& value, & compare] (const auto & e) {return compare(e, value);}));

            const auto distance = std::distance(first, last);

            auto position = static_cast<decltype(distance)>(0);
            auto step = static_cast<decltype(distance)>(1);

            while (position + step < distance)
            {
                const auto current = std::next(first, step);
                if (compare(*current, value))
                {
                    first = std::next(current);
                    position += step + 1;
                    step *= 2;
                }
                else
                {
                    return std::lower_bound(first, current, value, compare);
                }
            }

            return std::lower_bound(first, last, value, compare);
        }